

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.h
# Opt level: O2

void __thiscall
CNetAddr::Serialize<ParamsStream<VectorWriter&,CAddress::SerParams>>
          (CNetAddr *this,ParamsStream<VectorWriter_&,_CAddress::SerParams> *s)

{
  long in_FS_OFFSET;
  
  if ((s->m_params->super_SerParams).enc == V2) {
    if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
      SerializeV2Stream<ParamsStream<VectorWriter&,CAddress::SerParams>>(this,s);
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    SerializeV1Stream<ParamsStream<VectorWriter&,CAddress::SerParams>>(this,s);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream& s) const
    {
        if (s.template GetParams<SerParams>().enc == Encoding::V2) {
            SerializeV2Stream(s);
        } else {
            SerializeV1Stream(s);
        }
    }